

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O0

void __thiscall QPushButton::mouseMoveEvent(QPushButton *this,QMouseEvent *e)

{
  bool bVar1;
  undefined1 uVar2;
  QPushButtonPrivate *this_00;
  QPointF *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool hit;
  QPushButtonPrivate *d;
  undefined4 in_stack_ffffffffffffffb0;
  WidgetAttribute in_stack_ffffffffffffffb4;
  QWidget *this_01;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QPushButton *)0x665e9e);
  bVar1 = QWidget::testAttribute((QWidget *)this_00,in_stack_ffffffffffffffb4);
  if (bVar1) {
    in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 & 0xffffff;
    bVar1 = QWidget::underMouse((QWidget *)0x665ec8);
    if (bVar1) {
      QSinglePointEvent::position((QSinglePointEvent *)0x665ed8);
      local_10 = QPointF::toPoint(in_RSI);
      uVar2 = (**(code **)(*(long *)in_RDI + 0x1a0))(in_RDI,&local_10);
      in_stack_ffffffffffffffb4 = CONCAT13(uVar2,(int3)in_stack_ffffffffffffffb4) & 0x1ffffff;
    }
    if (((byte)(in_stack_ffffffffffffffb4 >> 0x18) & 1) != ((byte)this_00->field_0x2c8 >> 5 & 1)) {
      QWidget::rect(this_01);
      QWidget::update((QWidget *)this_00,
                      (QRect *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      this_00->field_0x2c8 =
           this_00->field_0x2c8 & 0xdf | ((byte)(in_stack_ffffffffffffffb4 >> 0x18) & 1) << 5;
    }
  }
  QAbstractButton::mouseMoveEvent((QAbstractButton *)in_RSI,(QMouseEvent *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPushButton::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QPushButton);

    if (testAttribute(Qt::WA_Hover)) {
        bool hit = false;
        if (underMouse())
            hit = hitButton(e->position().toPoint());

        if (hit != d->hovering) {
            update(rect());
            d->hovering = hit;
        }
    }

    QAbstractButton::mouseMoveEvent(e);
}